

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

void __thiscall QMap<QByteArray,_QByteArray>::detach(QMap<QByteArray,_QByteArray> *this)

{
  bool bVar1;
  QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
  *in_RDI;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  *unaff_retaddr;
  QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
  *t;
  
  t = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                      *)0x16e1ac);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
    ::detach(unaff_retaddr);
  }
  else {
    operator_new(0x38);
    QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
    ::QMapData(in_RDI);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
    ::reset(unaff_retaddr,t);
  }
  return;
}

Assistant:

void detach()
    {
        if (d)
            d.detach();
        else
            d.reset(new MapData);
    }